

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O2

int h262_seqparm(bitstream *str,h262_seqparm *seqparm)

{
  int iVar1;
  long lVar2;
  char *__ptr;
  size_t sStack_50;
  uint32_t vbv;
  uint32_t br;
  uint32_t vs;
  uint32_t hs;
  
  hs = seqparm->horizontal_size & 0xfff;
  vs = seqparm->vertical_size & 0xfff;
  br = seqparm->bit_rate & 0x3ffff;
  vbv = seqparm->vbv_buffer_size & 0x3ff;
  if ((str->dir != VS_ENCODE) || (seqparm->is_ext != 0)) {
LAB_001033c8:
    iVar1 = vs_u(str,&hs,0xc);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_u(str,&vs,0xc);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_u(str,&seqparm->aspect_ratio_information,4);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_u(str,&seqparm->frame_rate_code,4);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_u(str,&br,0x12);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_mark(str,1,1);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_u(str,&vbv,10);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_u(str,&seqparm->constrained_parameters_flag,1);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_u(str,&seqparm->load_intra_quantiser_matrix,1);
    if (iVar1 != 0) {
      return 1;
    }
    if (seqparm->load_intra_quantiser_matrix != 0) {
      lVar2 = 0x20;
      while (lVar2 + 4 != 0x124) {
        iVar1 = vs_u(str,(uint32_t *)((long)seqparm->intra_quantiser_matrix + lVar2 + -0x20),8);
        lVar2 = lVar2 + 4;
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    iVar1 = vs_u(str,&seqparm->load_non_intra_quantiser_matrix,1);
    if (iVar1 != 0) {
      return 1;
    }
    if (seqparm->load_non_intra_quantiser_matrix != 0) {
      lVar2 = 0;
      while (lVar2 + 4 != 0x104) {
        iVar1 = vs_u(str,(uint32_t *)((long)seqparm->non_intra_quantiser_matrix + lVar2),8);
        lVar2 = lVar2 + 4;
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    if (str->dir == VS_DECODE) {
      seqparm->horizontal_size = hs;
      seqparm->vertical_size = vs;
      seqparm->bit_rate = br;
      seqparm->vbv_buffer_size = vbv;
      seqparm->is_ext = 0;
      seqparm->has_disp_ext = 0;
    }
    else if (seqparm->is_ext != 0) {
      return 0;
    }
    iVar1 = vs_infer(str,&seqparm->progressive_sequence,1);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_infer(str,&seqparm->chroma_format,1);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_infer(str,&seqparm->low_delay,0);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_infer(str,&seqparm->low_delay,0);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_infer(str,&seqparm->frame_rate_extension_n,0);
    if (iVar1 == 0) {
      iVar1 = vs_infer(str,&seqparm->frame_rate_extension_d,0);
      if (iVar1 == 0) {
        return 0;
      }
      return 1;
    }
    return 1;
  }
  if (seqparm->horizontal_size < 0x1000) {
    if (0xfff < seqparm->vertical_size) {
      __ptr = "vertical_size too big for MPEG1\n";
      sStack_50 = 0x20;
      goto LAB_0010352e;
    }
    if (0x3ffff < seqparm->bit_rate) {
      __ptr = "bit_rate too big for MPEG1\n";
      sStack_50 = 0x1b;
      goto LAB_0010352e;
    }
    if (seqparm->vbv_buffer_size < 0x400) goto LAB_001033c8;
    __ptr = "vbv_buffer_size too big for MPEG1\n";
  }
  else {
    __ptr = "horizontal_size too big for MPEG1\n";
  }
  sStack_50 = 0x22;
LAB_0010352e:
  fwrite(__ptr,sStack_50,1,_stderr);
  return 1;
}

Assistant:

int h262_seqparm(struct bitstream *str, struct h262_seqparm *seqparm) {
	uint32_t hs = seqparm->horizontal_size & 0xfff;
	uint32_t vs = seqparm->vertical_size & 0xfff;
	uint32_t br = seqparm->bit_rate & 0x3ffff;
	uint32_t vbv = seqparm->vbv_buffer_size & 0x3ff;
	int i;
	if (str->dir == VS_ENCODE && !seqparm->is_ext) {
		if (hs != seqparm->horizontal_size) {
			fprintf(stderr, "horizontal_size too big for MPEG1\n");
			return 1;
		}
		if (vs != seqparm->vertical_size) {
			fprintf(stderr, "vertical_size too big for MPEG1\n");
			return 1;
		}
		if (br != seqparm->bit_rate) {
			fprintf(stderr, "bit_rate too big for MPEG1\n");
			return 1;
		}
		if (vbv != seqparm->vbv_buffer_size) {
			fprintf(stderr, "vbv_buffer_size too big for MPEG1\n");
			return 1;
		}
	}
	if (vs_u(str, &hs, 12)) return 1;
	if (vs_u(str, &vs, 12)) return 1;
	if (vs_u(str, &seqparm->aspect_ratio_information, 4)) return 1;
	if (vs_u(str, &seqparm->frame_rate_code, 4)) return 1;
	if (vs_u(str, &br, 18)) return 1;
	if (vs_mark(str, 1, 1)) return 1;
	if (vs_u(str, &vbv, 10)) return 1;
	if (vs_u(str, &seqparm->constrained_parameters_flag, 1)) return 1;
	if (vs_u(str, &seqparm->load_intra_quantiser_matrix, 1)) return 1;
	if (seqparm->load_intra_quantiser_matrix) {
		for (i = 0; i < 64; i++)
			if (vs_u(str, &seqparm->intra_quantiser_matrix[i], 8)) return 1;
	}
	if (vs_u(str, &seqparm->load_non_intra_quantiser_matrix, 1)) return 1;
	if (seqparm->load_non_intra_quantiser_matrix) {
		for (i = 0; i < 64; i++)
			if (vs_u(str, &seqparm->non_intra_quantiser_matrix[i], 8)) return 1;
	}
	if (str->dir == VS_DECODE) {
		seqparm->horizontal_size = hs;
		seqparm->vertical_size = vs;
		seqparm->bit_rate = br;
		seqparm->vbv_buffer_size = vbv;
		seqparm->is_ext = 0;
		seqparm->has_disp_ext = 0;
	}
	if (!seqparm->is_ext) {
		if (vs_infer(str, &seqparm->progressive_sequence, 1)) return 1;
		if (vs_infer(str, &seqparm->chroma_format, 1)) return 1;
		if (vs_infer(str, &seqparm->low_delay, 0)) return 1;
		if (vs_infer(str, &seqparm->low_delay, 0)) return 1;
		if (vs_infer(str, &seqparm->frame_rate_extension_n, 0)) return 1;
		if (vs_infer(str, &seqparm->frame_rate_extension_d, 0)) return 1;
	}
	return 0;
}